

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O3

bool __thiscall
miniros::master::ParameterStorage::hasParam(ParameterStorage *this,string *caller_id,string *key)

{
  int iVar1;
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> pVar2;
  string fullKey;
  Path fullPath;
  string local_80;
  Path local_60;
  
  names::resolve(&local_80,caller_id,key,false);
  names::Path::Path(&local_60);
  names::Path::fromString(&local_60,&local_80);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_parameterLock);
  if (iVar1 == 0) {
    pVar2 = findParameter(this,&local_60,false);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_parameterLock);
    names::Path::~Path(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    return pVar2.first != (XmlRpcValue *)0x0;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

bool ParameterStorage::hasParam(const std::string& caller_id, const std::string& key) const
{
  std::string fullKey = miniros::names::resolve(caller_id, key, false);
  names::Path fullPath;
  fullPath.fromString(fullKey);

  std::scoped_lock<std::mutex> lock(m_parameterLock);
  RpcValue* param = this->findParameter(fullPath, false).first;
  return param != nullptr;
}